

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::fill_line_buffer(lexer *this,size_t n)

{
  lexer_char_t *plVar1;
  byte bVar2;
  lexer_char_t *plVar3;
  long lVar4;
  ulong uVar5;
  lexer_char_t *plVar6;
  bool bVar7;
  long local_70;
  long offset_cursor;
  long offset_marker;
  size_t num_processed_chars;
  size_t n_local;
  lexer *this_local;
  
  bVar2 = std::__cxx11::string::empty();
  bVar7 = true;
  if ((bVar2 & 1) == 0) {
    plVar1 = this->m_content;
    plVar3 = (lexer_char_t *)std::__cxx11::string::data();
    bVar7 = plVar1 == plVar3;
  }
  if (!bVar7) {
    __assert_fail("m_line_buffer.empty() or m_content == reinterpret_cast<const lexer_char_t*>(m_line_buffer.data())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a65,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  bVar2 = std::__cxx11::string::empty();
  bVar7 = true;
  if ((bVar2 & 1) == 0) {
    plVar1 = this->m_limit;
    plVar3 = this->m_content;
    lVar4 = std::__cxx11::string::size();
    bVar7 = plVar1 == plVar3 + lVar4;
  }
  if (!bVar7) {
    __assert_fail("m_line_buffer.empty() or m_limit == m_content + m_line_buffer.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a69,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (this->m_start < this->m_content) {
    __assert_fail("m_content <= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6c,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (this->m_cursor < this->m_start) {
    __assert_fail("m_start <= m_cursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6d,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  if (this->m_limit < this->m_cursor) {
    __assert_fail("m_cursor <= m_limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6e,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  bVar7 = true;
  if (this->m_marker != (lexer_char_t *)0x0) {
    bVar7 = this->m_marker <= this->m_limit;
  }
  if (bVar7) {
    if (this->m_marker == (lexer_char_t *)0x0) {
      local_70 = 0;
    }
    else {
      local_70 = (long)this->m_marker - (long)this->m_start;
    }
    plVar1 = this->m_cursor;
    plVar3 = this->m_start;
    if ((this->m_stream == (istream *)0x0) || (uVar5 = std::ios::eof(), (uVar5 & 1) != 0)) {
      std::__cxx11::string::assign<unsigned_char_const*,void>
                ((string *)&this->m_line_buffer,this->m_start,this->m_limit);
      std::__cxx11::string::append((ulong)&this->m_line_buffer,'\x01');
      if (n != 0) {
        std::__cxx11::string::append((ulong)&this->m_line_buffer,(char)n + -1);
      }
    }
    else {
      std::__cxx11::string::erase((ulong)&this->m_line_buffer,0);
      std::__cxx11::string::clear();
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (this->m_stream,(string *)&this->m_line_buffer_tmp,'\n');
      std::__cxx11::string::operator+=
                ((string *)&this->m_line_buffer,(string *)&this->m_line_buffer_tmp);
      std::__cxx11::string::push_back((char)this + '\b');
    }
    plVar6 = (lexer_char_t *)std::__cxx11::string::data();
    this->m_content = plVar6;
    if (this->m_content == (lexer_char_t *)0x0) {
      __assert_fail("m_content != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a97,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    this->m_start = this->m_content;
    this->m_marker = this->m_start + local_70;
    this->m_cursor = this->m_start + ((long)plVar1 - (long)plVar3);
    plVar1 = this->m_start;
    lVar4 = std::__cxx11::string::size();
    this->m_limit = plVar1 + lVar4;
    return;
  }
  __assert_fail("m_marker == nullptr or m_marker <= m_limit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                ,0x2a6f,
                "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
               );
}

Assistant:

void fill_line_buffer(size_t n = 0)
        {
            // if line buffer is used, m_content points to its data
            assert(m_line_buffer.empty()
                   or m_content == reinterpret_cast<const lexer_char_t*>(m_line_buffer.data()));

            // if line buffer is used, m_limit is set past the end of its data
            assert(m_line_buffer.empty()
                   or m_limit == m_content + m_line_buffer.size());

            // pointer relationships
            assert(m_content <= m_start);
            assert(m_start <= m_cursor);
            assert(m_cursor <= m_limit);
            assert(m_marker == nullptr or m_marker  <= m_limit);

            // number of processed characters (p)
            const auto num_processed_chars = static_cast<size_t>(m_start - m_content);
            // offset for m_marker wrt. to m_start
            const auto offset_marker = (m_marker == nullptr) ? 0 : m_marker - m_start;
            // number of unprocessed characters (u)
            const auto offset_cursor = m_cursor - m_start;

            // no stream is used or end of file is reached
            if (m_stream == nullptr or m_stream->eof())
            {
                // m_start may or may not be pointing into m_line_buffer at
                // this point. We trust the standard library to do the right
                // thing. See http://stackoverflow.com/q/28142011/266378
                m_line_buffer.assign(m_start, m_limit);

                // append n characters to make sure that there is sufficient
                // space between m_cursor and m_limit
                m_line_buffer.append(1, '\x00');
                if (n > 0)
                {
                    m_line_buffer.append(n - 1, '\x01');
                }
            }
            else
            {
                // delete processed characters from line buffer
                m_line_buffer.erase(0, num_processed_chars);
                // read next line from input stream
                m_line_buffer_tmp.clear();
                std::getline(*m_stream, m_line_buffer_tmp, '\n');

                // add line with newline symbol to the line buffer
                m_line_buffer += m_line_buffer_tmp;
                m_line_buffer.push_back('\n');
            }

            // set pointers
            m_content = reinterpret_cast<const lexer_char_t*>(m_line_buffer.data());
            assert(m_content != nullptr);
            m_start  = m_content;
            m_marker = m_start + offset_marker;
            m_cursor = m_start + offset_cursor;
            m_limit  = m_start + m_line_buffer.size();
        }